

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O3

void __thiscall Refal2::CScanner::warning(CScanner *this,TWarning warning,char c)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int line;
  int position;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  ostringstream warningStream;
  string local_1c0;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  if (warning == W_SymbolAfterPlus) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"unuseful symbol `",0x11);
    local_1c0._M_dataplus._M_p._0_1_ = c;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a0,(char *)&local_1c0,1);
    lVar3 = 0xc;
    pcVar4 = "` after plus";
  }
  else {
    if (warning != W_Semicolon) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Scanner.cpp"
                    ,0xa2,"void Refal2::CScanner::warning(TWarning, char)");
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"using `",7);
    local_1c0._M_dataplus._M_p._0_1_ = c;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a0,(char *)&local_1c0,1);
    lVar3 = 0x1a;
    pcVar4 = "` as line feed is obsolete";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,lVar3);
  line = this->line;
  position = this->position;
  paVar1 = &local_1c0.field_2;
  local_1c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_1c0,'\x01');
  CError::SetTokenData((CError *)this,line,position,&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  std::__cxx11::stringbuf::str();
  CErrorsHelper::RaiseError((CErrorsHelper *)this,ES_Warning,&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  CError::ResetToken((CError *)this);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void CScanner::warning( TWarning warning, char c )
{
	std::ostringstream warningStream;
	switch( warning ) {
		case W_Semicolon:
			warningStream << "using `" << c << "` as line feed is obsolete";
			break;
		case W_SymbolAfterPlus:
			warningStream << "unuseful symbol `" << c << "` after plus";
			break;
		default:
			assert( false );
			break;
	}
	CError::SetTokenData( line, position, std::string( 1, c ) );
	CErrorsHelper::RaiseError( ES_Warning, warningStream.str() );
	CError::ResetToken();
}